

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Btree *pBVar1;
  char *pcVar2;
  Btree *pBt;
  char *in_stack_ffffffffffffffe0;
  sqlite3 *in_stack_ffffffffffffffe8;
  
  pBVar1 = sqlite3DbNameToBtree(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pBVar1 == (Btree *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = sqlite3BtreeGetFilename((Btree *)0x122684);
  }
  return pcVar2;
}

Assistant:

SQLITE_API const char *SQLITE_STDCALL sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}